

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

Boxed_Value
chaiscript::dispatch::detail::Do_Call<std::shared_ptr<unsigned_short>>::
go<std::shared_ptr<unsigned_short>(),chaiscript::dispatch::detail::Constructor<unsigned_short>>
          (Constructor<unsigned_short> *fun,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  Boxed_Value BVar3;
  shared_ptr<unsigned_short> local_20;
  
  local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003129e8;
  local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
       1);
  *(undefined2 *)
   &local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 0;
  sVar2 = Boxed_Value::Object_Data::get<unsigned_short>((Object_Data *)fun,&local_20,true);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)fun;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }